

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scm_gun(void)

{
  cell_map local_28;
  
  scm_stop();
  if (width < 0x26) {
    width = 0x26;
  }
  if (height < 0xb) {
    height = 0xb;
  }
  cell_map::cell_map(&local_28,width,height);
  cell_map::operator=(&grid,&local_28);
  cell_map::~cell_map(&local_28);
  cell_map::set_cell(&grid,1,5);
  cell_map::set_cell(&grid,2,5);
  cell_map::set_cell(&grid,1,6);
  cell_map::set_cell(&grid,2,6);
  cell_map::set_cell(&grid,0x23,3);
  cell_map::set_cell(&grid,0x24,3);
  cell_map::set_cell(&grid,0x23,4);
  cell_map::set_cell(&grid,0x24,4);
  cell_map::set_cell(&grid,0xb,5);
  cell_map::set_cell(&grid,0xb,6);
  cell_map::set_cell(&grid,0xb,7);
  cell_map::set_cell(&grid,0xc,4);
  cell_map::set_cell(&grid,0xc,8);
  cell_map::set_cell(&grid,0xd,3);
  cell_map::set_cell(&grid,0xd,9);
  cell_map::set_cell(&grid,0xe,3);
  cell_map::set_cell(&grid,0xe,9);
  cell_map::set_cell(&grid,0xf,6);
  cell_map::set_cell(&grid,0x10,4);
  cell_map::set_cell(&grid,0x10,8);
  cell_map::set_cell(&grid,0x11,5);
  cell_map::set_cell(&grid,0x11,6);
  cell_map::set_cell(&grid,0x11,7);
  cell_map::set_cell(&grid,0x12,6);
  cell_map::set_cell(&grid,0x15,3);
  cell_map::set_cell(&grid,0x15,4);
  cell_map::set_cell(&grid,0x15,5);
  cell_map::set_cell(&grid,0x16,3);
  cell_map::set_cell(&grid,0x16,4);
  cell_map::set_cell(&grid,0x16,5);
  cell_map::set_cell(&grid,0x17,2);
  cell_map::set_cell(&grid,0x17,6);
  cell_map::set_cell(&grid,0x19,1);
  cell_map::set_cell(&grid,0x19,2);
  cell_map::set_cell(&grid,0x19,6);
  cell_map::set_cell(&grid,0x19,7);
  paint_grid();
  return;
}

Assistant:

void scm_gun()
  {
  scm_stop();
  if (width < 38)
    width = 38;
  if (height < 11)
    height = 11;
  grid = cell_map(width, height);

  grid.set_cell(1, 5);
  grid.set_cell(2, 5);
  grid.set_cell(1, 6);
  grid.set_cell(2, 6);

  grid.set_cell(35, 3);
  grid.set_cell(36, 3);
  grid.set_cell(35, 4);
  grid.set_cell(36, 4);

  grid.set_cell(11, 5);
  grid.set_cell(11, 6);
  grid.set_cell(11, 7);
  grid.set_cell(12, 4);
  grid.set_cell(12, 8);
  grid.set_cell(13, 3);
  grid.set_cell(13, 9);
  grid.set_cell(14, 3);
  grid.set_cell(14, 9);
  grid.set_cell(15, 6);
  grid.set_cell(16, 4);
  grid.set_cell(16, 8);
  grid.set_cell(17, 5);
  grid.set_cell(17, 6);
  grid.set_cell(17, 7);
  grid.set_cell(18, 6);

  grid.set_cell(21, 3);
  grid.set_cell(21, 4);
  grid.set_cell(21, 5);
  grid.set_cell(22, 3);
  grid.set_cell(22, 4);
  grid.set_cell(22, 5);
  grid.set_cell(23, 2);
  grid.set_cell(23, 6);
  grid.set_cell(25, 1);
  grid.set_cell(25, 2);
  grid.set_cell(25, 6);
  grid.set_cell(25, 7);
  paint_grid();
  }